

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O1

void __thiscall
cmComputeComponentGraph::cmComputeComponentGraph(cmComputeComponentGraph *this,Graph *input)

{
  this->InputGraph = input;
  memset(&this->ComponentGraph,0,200);
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&this->TarjanStack,0);
  return;
}

Assistant:

cmComputeComponentGraph::cmComputeComponentGraph(Graph const& input)
  : InputGraph(input)
{
}